

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

void NULLC::AssertCoroutine(NULLCRef f)

{
  uint uVar1;
  char *__function;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  if (in_stack_00000008 < *(uint *)(linker + 0x20c)) {
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + (ulong)in_stack_00000008 * 0x50) != 3) {
      nullcThrowError("Argument is not a function");
    }
    uVar1 = *(uint *)(CONCAT44(f.typeID,in_stack_0000000c) + 8);
    if (uVar1 < *(uint *)(linker + 0x24c)) {
      if (*(char *)(*(long *)(linker + 0x240) + 0x35 + (ulong)uVar1 * 0x94) == '\x03') {
        return;
      }
      nullcThrowError("ERROR: function is not a coroutine");
      return;
    }
    __function = 
    "T &FastVector<ExternFuncInfo>::operator[](unsigned int) [T = ExternFuncInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  else {
    __function = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,__function);
}

Assistant:

void NULLC::AssertCoroutine(NULLCRef f)
{
	if(linker->exTypes[f.typeID].subCat != ExternTypeInfo::CAT_FUNCTION)
		nullcThrowError("Argument is not a function");

	NULLCFuncPtr *fPtr = (NULLCFuncPtr*)f.ptr;
	if(linker->exFunctions[fPtr->id].funcCat != ExternFuncInfo::COROUTINE)
		nullcThrowError("ERROR: function is not a coroutine");
}